

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall Json_Null_Test::Json_Null_Test(Json_Null_Test *this)

{
  Json_Null_Test *this_local;
  
  anon_unknown.dwarf_94447::Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__Json_Null_Test_00259840;
  return;
}

Assistant:

TEST_F (Json, Null) {
    StrictMock<mock_json_callbacks> callbacks;
    callbacks_proxy<mock_json_callbacks> proxy (callbacks);
    EXPECT_CALL (callbacks, null_value ()).Times (1);

    json::parser<decltype (proxy)> p (proxy);
    p.input (" null "s).eof ();
    EXPECT_FALSE (p.has_error ());
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}